

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *__s2;
  wchar_t wVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  wchar_t wVar8;
  ImDrawCmd *pIVar9;
  ImDrawChannel *pIVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  int i;
  int i_00;
  ulong uVar13;
  long lVar14;
  ImWchar *__dest;
  int iVar15;
  int iVar16;
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    ImDrawList::_PopUnusedDrawCmd(draw_list);
    if ((this->_Count < 1) || ((draw_list->CmdBuffer).Size < 1)) {
      pIVar9 = (ImDrawCmd *)0x0;
      iVar12 = 0;
    }
    else {
      pIVar9 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
      iVar12 = pIVar9->ElemCount + pIVar9->IdxOffset;
    }
    iVar15 = 0;
    iVar16 = 0;
    for (i_00 = 1; i_00 < this->_Count; i_00 = i_00 + 1) {
      pIVar10 = ImVector<ImDrawChannel>::operator[]
                          ((ImVector<ImDrawChannel> *)&this->_Channels,i_00);
      if ((L'\0' < (pIVar10->_CmdBuffer).Size) &&
         (pIVar11 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)pIVar10),
         pIVar11->ElemCount == 0)) {
        ImVector<ImDrawCmd>::pop_back((ImVector<ImDrawCmd> *)pIVar10);
      }
      wVar8 = (pIVar10->_CmdBuffer).Size;
      if (pIVar9 != (ImDrawCmd *)0x0 && L'\0' < wVar8) {
        pIVar11 = ImVector<ImDrawCmd>::operator[]((ImVector<ImDrawCmd> *)pIVar10,0);
        iVar7 = bcmp(pIVar9,pIVar11,0x1c);
        if ((iVar7 == 0) &&
           (pIVar11->UserCallback == (ImDrawCallback)0x0 &&
            pIVar9->UserCallback == (ImDrawCallback)0x0)) {
          pIVar9->ElemCount = pIVar9->ElemCount + pIVar11->ElemCount;
          iVar12 = iVar12 + pIVar11->ElemCount;
          ImVector<ImDrawCmd>::erase((ImVector<ImDrawCmd> *)pIVar10,(pIVar10->_CmdBuffer).Data);
        }
        wVar8 = (pIVar10->_CmdBuffer).Size;
      }
      if (L'\0' < wVar8) {
        pIVar9 = ImVector<ImDrawCmd>::back((ImVector<ImDrawCmd> *)pIVar10);
        wVar8 = (pIVar10->_CmdBuffer).Size;
      }
      wVar1 = (pIVar10->_IdxBuffer).Size;
      pIVar11 = (pIVar10->_CmdBuffer).Data;
      uVar13 = 0;
      if (L'\0' < wVar8) {
        uVar13 = (ulong)(uint)wVar8;
      }
      for (lVar14 = 0; uVar13 * 0x38 - lVar14 != 0; lVar14 = lVar14 + 0x38) {
        *(int *)((long)&pIVar11->IdxOffset + lVar14) = iVar12;
        iVar12 = iVar12 + *(int *)((long)&pIVar11->ElemCount + lVar14);
      }
      iVar15 = iVar15 + wVar8;
      iVar16 = iVar16 + wVar1;
    }
    ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + iVar15);
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)&draw_list->IdxBuffer,
               (draw_list->IdxBuffer).Size + iVar16);
    pIVar9 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar15);
    __dest = (draw_list->IdxBuffer).Data + ((long)(draw_list->IdxBuffer).Size - (long)iVar16);
    for (iVar12 = 1; iVar12 < this->_Count; iVar12 = iVar12 + 1) {
      pIVar10 = ImVector<ImDrawChannel>::operator[]
                          ((ImVector<ImDrawChannel> *)&this->_Channels,iVar12);
      lVar14 = (long)(pIVar10->_CmdBuffer).Size;
      if (lVar14 != 0) {
        memcpy(pIVar9,(pIVar10->_CmdBuffer).Data,lVar14 * 0x38);
        pIVar9 = pIVar9 + lVar14;
      }
      lVar14 = (long)(pIVar10->_IdxBuffer).Size;
      if (lVar14 != 0) {
        memcpy(__dest,(pIVar10->_IdxBuffer).Data,lVar14 * 2);
        __dest = __dest + lVar14;
      }
    }
    draw_list->_IdxWritePtr = __dest;
    if (((draw_list->CmdBuffer).Size == 0) ||
       (pIVar9 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer),
       pIVar9->UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(draw_list);
    }
    pIVar9 = (draw_list->CmdBuffer).Data;
    iVar12 = (draw_list->CmdBuffer).Size;
    pIVar11 = pIVar9 + (long)iVar12 + -1;
    __s2 = &draw_list->_CmdHeader;
    if (pIVar9[(long)iVar12 + -1].ElemCount == 0) {
      fVar3 = (__s2->ClipRect).x;
      fVar4 = (__s2->ClipRect).y;
      fVar5 = (draw_list->_CmdHeader).ClipRect.z;
      fVar6 = (draw_list->_CmdHeader).ClipRect.w;
      uVar2 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar9[(long)iVar12 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar9[(long)iVar12 + -1].TextureId + 4) = uVar2;
      (pIVar11->ClipRect).x = fVar3;
      (pIVar11->ClipRect).y = fVar4;
      pIVar9[(long)iVar12 + -1].ClipRect.z = fVar5;
      pIVar9[(long)iVar12 + -1].ClipRect.w = fVar6;
    }
    else {
      iVar12 = bcmp(pIVar11,__s2,0x1c);
      if (iVar12 != 0) {
        ImDrawList::AddDrawCmd(draw_list);
      }
    }
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}